

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcFaceBound::IfcFaceBound(IfcFaceBound *this)

{
  IfcFaceBound *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x58,"IfcFaceBound");
  IfcTopologicalRepresentationItem::IfcTopologicalRepresentationItem
            (&this->super_IfcTopologicalRepresentationItem,&PTR_construction_vtable_24__010ee3d0);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcFaceBound,_2UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcFaceBound,_2UL> *)
             &(this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
              super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20,
             &PTR_construction_vtable_24__010ee418);
  (this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x10ee340;
  *(undefined8 *)&this->field_0x58 = 0x10ee3b8;
  *(undefined8 *)
   &(this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x10ee368;
  *(undefined8 *)
   &(this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x10ee390;
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcLoop>::Lazy
            ((Lazy<Assimp::IFC::Schema_2x3::IfcLoop> *)
             &(this->super_IfcTopologicalRepresentationItem).field_0x30,(LazyObject *)0x0);
  std::__cxx11::string::string((string *)&this->Orientation);
  return;
}

Assistant:

IfcFaceBound() : Object("IfcFaceBound") {}